

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O0

void __thiscall
cfg::tag_vector_t<cfgfile::string_trait_t>::tag_vector_t
          (tag_vector_t<cfgfile::string_trait_t> *this)

{
  tag_t<cfgfile::string_trait_t> *in_RDI;
  string *in_stack_ffffffffffffff38;
  tag_t<cfgfile::string_trait_t> *str;
  undefined8 in_stack_ffffffffffffff40;
  undefined1 is_mandatory;
  allocator *name;
  tag_vector_of_tags_t<cfg::tag_tags_t<cfgfile::string_trait_t>,_cfgfile::string_trait_t> *this_00;
  allocator local_a1;
  string local_a0 [32];
  string local_80 [55];
  undefined1 local_49 [33];
  string local_28 [40];
  
  is_mandatory = (undefined1)((ulong)in_stack_ffffffffffffff40 >> 0x38);
  this_00 = (tag_vector_of_tags_t<cfg::tag_tags_t<cfgfile::string_trait_t>,_cfgfile::string_trait_t>
             *)local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_49 + 1),"vector",(allocator *)this_00);
  cfgfile::string_trait_t::from_ascii(in_stack_ffffffffffffff38);
  cfgfile::tag_no_value_t<cfgfile::string_trait_t>::tag_no_value_t
            ((tag_no_value_t<cfgfile::string_trait_t> *)this_00,(string_t *)in_RDI,
             (bool)is_mandatory);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::~string((string *)(local_49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  in_RDI->_vptr_tag_t = (_func_int **)&PTR__tag_vector_t_00179580;
  str = in_RDI + 1;
  name = &local_a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"vector",name);
  cfgfile::string_trait_t::from_ascii((string *)str);
  cfgfile::tag_vector_of_tags_t<cfg::tag_tags_t<cfgfile::string_trait_t>,_cfgfile::string_trait_t>::
  tag_vector_of_tags_t(this_00,in_RDI,(string_t *)name,SUB81((ulong)str >> 0x38,0));
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  return;
}

Assistant:

tag_vector_t()
		:	cfgfile::tag_no_value_t< Trait >( Trait::from_ascii( "vector" ), true )
		,	m_vector( *this, Trait::from_ascii( "vector" ), true )
	{
	}